

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall
leveldb::DBTest_GetOrderedByLevels_Test::~DBTest_GetOrderedByLevels_Test
          (DBTest_GetOrderedByLevels_Test *this)

{
  DBTest_GetOrderedByLevels_Test *this_local;
  
  ~DBTest_GetOrderedByLevels_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(DBTest, GetOrderedByLevels) {
  do {
    ASSERT_LEVELDB_OK(Put("foo", "v1"));
    Compact("a", "z");
    ASSERT_EQ("v1", Get("foo"));
    ASSERT_LEVELDB_OK(Put("foo", "v2"));
    ASSERT_EQ("v2", Get("foo"));
    dbfull()->TEST_CompactMemTable();
    ASSERT_EQ("v2", Get("foo"));
  } while (ChangeOptions());
}